

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateInterleave(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  int level;
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined8 *puVar5;
  bool bVar6;
  xmlNodePtr pxVar7;
  int iVar8;
  xmlNodePtr pxVar9;
  void *__s;
  void *__s_00;
  xmlRelaxNGValidStatePtr pxVar10;
  int local_a0;
  int local_9c;
  int lowattr;
  int best;
  int found;
  int j;
  void *tmp;
  xmlNodePtr *lasts;
  xmlNodePtr *list;
  xmlNodePtr lastelem;
  xmlNodePtr lastchg;
  xmlNodePtr last;
  xmlNodePtr start;
  xmlNodePtr cur;
  xmlRelaxNGInterleaveGroupPtr group;
  xmlRelaxNGPartitionPtr partitions;
  xmlRelaxNGValidStatePtr oldstate;
  int oldflags;
  int errNr;
  int nbgroups;
  int i;
  int ret;
  xmlRelaxNGDefinePtr_conflict define_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  nbgroups = 0;
  level = ctxt->errNr;
  lastchg = (xmlNodePtr)0x0;
  lastelem = (xmlNodePtr)0x0;
  if (define->data == (void *)0x0) {
    xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_INTERNODATA,(xmlChar *)0x0,(xmlChar *)0x0,0);
    ctxt_local._4_4_ = -1;
  }
  else {
    piVar3 = (int *)define->data;
    iVar1 = *piVar3;
    iVar2 = ctxt->flags;
    if (((define->dflags & 8U) == 0) || (ctxt->flags = ctxt->flags | 4, iVar1 != 2)) {
      __s = (*xmlMalloc)((long)iVar1 << 3);
      if (__s == (void *)0x0) {
        xmlRngVErrMemory(ctxt);
        ctxt_local._4_4_ = -1;
      }
      else {
        memset(__s,0,(long)iVar1 << 3);
        __s_00 = (*xmlMalloc)((long)iVar1 << 3);
        if (__s_00 == (void *)0x0) {
          xmlRngVErrMemory(ctxt);
          ctxt_local._4_4_ = -1;
        }
        else {
          memset(__s_00,0,(long)iVar1 << 3);
          pxVar9 = xmlRelaxNGSkipIgnored(ctxt,ctxt->state->seq);
          for (start = pxVar9; pxVar7 = start, start != (xmlNodePtr)0x0;
              start = xmlRelaxNGSkipIgnored(ctxt,start->next)) {
            ctxt->state->seq = start;
            if ((*(long *)(piVar3 + 2) == 0) || ((piVar3[4] & 1U) == 0)) {
              errNr = 0;
              while ((errNr < iVar1 &&
                     ((lVar4 = *(long *)(*(long *)(piVar3 + 6) + (long)errNr * 8), lVar4 == 0 ||
                      (iVar8 = xmlRelaxNGNodeMatchesList
                                         (start,*(xmlRelaxNGDefinePtr_conflict **)(lVar4 + 8)),
                      iVar8 == 0))))) {
                errNr = errNr + 1;
              }
            }
            else {
              _found = (void *)0x0;
              if ((start->type == XML_TEXT_NODE) || (start->type == XML_CDATA_SECTION_NODE)) {
                _found = xmlHashLookup2(*(xmlHashTablePtr *)(piVar3 + 2),(xmlChar *)"#text",
                                        (xmlChar *)0x0);
              }
              else if (start->type == XML_ELEMENT_NODE) {
                if (start->ns == (xmlNs *)0x0) {
                  _found = xmlHashLookup2(*(xmlHashTablePtr *)(piVar3 + 2),start->name,
                                          (xmlChar *)0x0);
                }
                else {
                  _found = xmlHashLookup2(*(xmlHashTablePtr *)(piVar3 + 2),start->name,
                                          start->ns->href);
                  if (_found == (void *)0x0) {
                    _found = xmlHashLookup2(*(xmlHashTablePtr *)(piVar3 + 2),"#any",start->ns->href)
                    ;
                  }
                }
                if (_found == (void *)0x0) {
                  _found = xmlHashLookup2(*(xmlHashTablePtr *)(piVar3 + 2),"#any",(xmlChar *)0x0);
                }
              }
              errNr = iVar1;
              if (((_found != (void *)0x0) && (errNr = (int)_found + -1, (piVar3[4] & 2U) != 0)) &&
                 (iVar8 = xmlRelaxNGNodeMatchesList
                                    (start,*(xmlRelaxNGDefinePtr_conflict **)
                                            (*(long *)(*(long *)(piVar3 + 6) + (long)errNr * 8) + 8)
                                    ), iVar8 == 0)) {
                errNr = iVar1;
              }
            }
            if (iVar1 <= errNr) break;
            if (*(long *)((long)__s_00 + (long)errNr * 8) == 0) {
              *(xmlNodePtr *)((long)__s + (long)errNr * 8) = start;
              *(xmlNodePtr *)((long)__s_00 + (long)errNr * 8) = start;
            }
            else {
              *(xmlNodePtr *)(*(long *)((long)__s_00 + (long)errNr * 8) + 0x30) = start;
              *(xmlNodePtr *)((long)__s_00 + (long)errNr * 8) = start;
            }
            if (start->next == (_xmlNode *)0x0) {
              lastelem = start;
            }
            else {
              lastelem = start->next;
            }
          }
          partitions = (xmlRelaxNGPartitionPtr)ctxt->state;
          for (errNr = 0; errNr < iVar1; errNr = errNr + 1) {
            pxVar10 = xmlRelaxNGCopyValidState(ctxt,(xmlRelaxNGValidStatePtr)partitions);
            ctxt->state = pxVar10;
            if (ctxt->state == (xmlRelaxNGValidStatePtr)0x0) {
              nbgroups = -1;
              break;
            }
            puVar5 = *(undefined8 **)(*(long *)(piVar3 + 6) + (long)errNr * 8);
            if (*(long *)((long)__s_00 + (long)errNr * 8) != 0) {
              lastchg = *(xmlNodePtr *)(*(long *)((long)__s_00 + (long)errNr * 8) + 0x30);
              *(undefined8 *)(*(long *)((long)__s_00 + (long)errNr * 8) + 0x30) = 0;
            }
            ctxt->state->seq = *(xmlNodePtr *)((long)__s + (long)errNr * 8);
            nbgroups = xmlRelaxNGValidateDefinition(ctxt,(xmlRelaxNGDefinePtr_conflict)*puVar5);
            if (nbgroups != 0) break;
            if (ctxt->state == (xmlRelaxNGValidStatePtr)0x0) {
              if (ctxt->states == (xmlRelaxNGStatesPtr)0x0) {
                nbgroups = -1;
                break;
              }
              bVar6 = false;
              local_9c = -1;
              local_a0 = -1;
              for (best = 0; best < ctxt->states->nbState; best = best + 1) {
                start = xmlRelaxNGSkipIgnored(ctxt,ctxt->states->tabState[best]->seq);
                if (start == (xmlNodePtr)0x0) {
                  if (!bVar6) {
                    local_a0 = ctxt->states->tabState[best]->nbAttrLeft;
                    local_9c = best;
                  }
                  bVar6 = true;
                  if (ctxt->states->tabState[best]->nbAttrLeft <= local_a0) {
                    local_a0 = ctxt->states->tabState[best]->nbAttrLeft;
                    local_9c = best;
                  }
                  if (local_a0 == 0) break;
                }
                else if (!bVar6) {
                  if (local_a0 == -1) {
                    local_a0 = ctxt->states->tabState[best]->nbAttrLeft;
                    local_9c = best;
                  }
                  else if (ctxt->states->tabState[best]->nbAttrLeft <= local_a0) {
                    local_a0 = ctxt->states->tabState[best]->nbAttrLeft;
                    local_9c = best;
                  }
                }
              }
              if (0 < ctxt->states->nbState) {
                xmlRelaxNGFreeValidState(ctxt,(xmlRelaxNGValidStatePtr)partitions);
                if (local_9c == -1) {
                  partitions = (xmlRelaxNGPartitionPtr)
                               ctxt->states->tabState[ctxt->states->nbState + -1];
                  ctxt->states->tabState[ctxt->states->nbState + -1] = (xmlRelaxNGValidStatePtr)0x0;
                  ctxt->states->nbState = ctxt->states->nbState + -1;
                }
                else {
                  partitions = (xmlRelaxNGPartitionPtr)ctxt->states->tabState[local_9c];
                  ctxt->states->tabState[local_9c] = (xmlRelaxNGValidStatePtr)0x0;
                }
              }
              for (best = 0; best < ctxt->states->nbState; best = best + 1) {
                xmlRelaxNGFreeValidState(ctxt,ctxt->states->tabState[best]);
              }
              xmlRelaxNGFreeStates(ctxt,ctxt->states);
              ctxt->states = (xmlRelaxNGStatesPtr)0x0;
              if (!bVar6) {
                if (start == (xmlNodePtr)0x0) {
                  xmlRelaxNGAddValidError
                            (ctxt,XML_RELAXNG_ERR_INTEREXTRA,(xmlChar *)"noname",(xmlChar *)0x0,0);
                }
                else {
                  xmlRelaxNGAddValidError
                            (ctxt,XML_RELAXNG_ERR_INTEREXTRA,start->name,(xmlChar *)0x0,0);
                }
                nbgroups = -1;
                ctxt->state = (xmlRelaxNGValidStatePtr)partitions;
                goto LAB_001d0928;
              }
            }
            else {
              start = xmlRelaxNGSkipIgnored(ctxt,ctxt->state->seq);
              xmlRelaxNGFreeValidState(ctxt,(xmlRelaxNGValidStatePtr)partitions);
              partitions = (xmlRelaxNGPartitionPtr)ctxt->state;
              ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
              if ((start != (xmlNodePtr)0x0) &&
                 ((define->parent->type != XML_RELAXNG_DEF ||
                  (iVar8 = xmlStrEqual(define->parent->name,(xmlChar *)"open-name-class"),
                  iVar8 == 0)))) {
                xmlRelaxNGAddValidError
                          (ctxt,XML_RELAXNG_ERR_INTEREXTRA,start->name,(xmlChar *)0x0,0);
                nbgroups = -1;
                ctxt->state = (xmlRelaxNGValidStatePtr)partitions;
                goto LAB_001d0928;
              }
            }
            if (*(long *)((long)__s_00 + (long)errNr * 8) != 0) {
              *(xmlNodePtr *)(*(long *)((long)__s_00 + (long)errNr * 8) + 0x30) = lastchg;
            }
          }
          if (ctxt->state != (xmlRelaxNGValidStatePtr)0x0) {
            xmlRelaxNGFreeValidState(ctxt,ctxt->state);
          }
          ctxt->state = (xmlRelaxNGValidStatePtr)partitions;
          ctxt->state->seq = pxVar7;
          if (nbgroups != 0) {
            xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_INTERSEQ,(xmlChar *)0x0,(xmlChar *)0x0,0);
            nbgroups = -1;
          }
LAB_001d0928:
          ctxt->flags = iVar2;
          for (start = lastelem;
              ((start != (xmlNodePtr)0x0 && (start != pxVar9)) && (start->prev != (_xmlNode *)0x0));
              start = start->prev) {
            start->prev->next = start;
          }
          if ((nbgroups == 0) && (level < ctxt->errNr)) {
            xmlRelaxNGPopErrors(ctxt,level);
          }
          (*xmlFree)(__s);
          (*xmlFree)(__s_00);
          ctxt_local._4_4_ = nbgroups;
        }
      }
    }
    else {
      if (ctxt->state != (xmlRelaxNGValidStatePtr)0x0) {
        pxVar9 = xmlRelaxNGSkipIgnored(ctxt,ctxt->state->seq);
        ctxt->state->seq = pxVar9;
      }
      if (**(int **)**(undefined8 **)(piVar3 + 6) == 3) {
        nbgroups = xmlRelaxNGValidateDefinition
                             (ctxt,(xmlRelaxNGDefinePtr_conflict)
                                   **(undefined8 **)(*(long *)(piVar3 + 6) + 8));
      }
      else {
        nbgroups = xmlRelaxNGValidateDefinition
                             (ctxt,*(xmlRelaxNGDefinePtr_conflict *)**(undefined8 **)(piVar3 + 6));
      }
      if ((nbgroups == 0) && (ctxt->state != (xmlRelaxNGValidStatePtr)0x0)) {
        pxVar9 = xmlRelaxNGSkipIgnored(ctxt,ctxt->state->seq);
        ctxt->state->seq = pxVar9;
      }
      ctxt->flags = iVar2;
      ctxt_local._4_4_ = nbgroups;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGValidateInterleave(xmlRelaxNGValidCtxtPtr ctxt,
                             xmlRelaxNGDefinePtr define)
{
    int ret = 0, i, nbgroups;
    int errNr = ctxt->errNr;
    int oldflags;

    xmlRelaxNGValidStatePtr oldstate;
    xmlRelaxNGPartitionPtr partitions;
    xmlRelaxNGInterleaveGroupPtr group = NULL;
    xmlNodePtr cur, start, last = NULL, lastchg = NULL, lastelem;
    xmlNodePtr *list = NULL, *lasts = NULL;

    if (define->data != NULL) {
        partitions = (xmlRelaxNGPartitionPtr) define->data;
        nbgroups = partitions->nbgroups;
    } else {
        VALID_ERR(XML_RELAXNG_ERR_INTERNODATA);
        return (-1);
    }
    /*
     * Optimizations for MIXED
     */
    oldflags = ctxt->flags;
    if (define->dflags & IS_MIXED) {
        ctxt->flags |= FLAGS_MIXED_CONTENT;
        if (nbgroups == 2) {
            /*
             * this is a pure <mixed> case
             */
            if (ctxt->state != NULL)
                ctxt->state->seq = xmlRelaxNGSkipIgnored(ctxt,
                                                         ctxt->state->seq);
            if (partitions->groups[0]->rule->type == XML_RELAXNG_TEXT)
                ret = xmlRelaxNGValidateDefinition(ctxt,
                                                   partitions->groups[1]->
                                                   rule);
            else
                ret = xmlRelaxNGValidateDefinition(ctxt,
                                                   partitions->groups[0]->
                                                   rule);
            if (ret == 0) {
                if (ctxt->state != NULL)
                    ctxt->state->seq = xmlRelaxNGSkipIgnored(ctxt,
                                                             ctxt->state->
                                                             seq);
            }
            ctxt->flags = oldflags;
            return (ret);
        }
    }

    /*
     * Build arrays to store the first and last node of the chain
     * pertaining to each group
     */
    list = (xmlNodePtr *) xmlMalloc(nbgroups * sizeof(xmlNodePtr));
    if (list == NULL) {
        xmlRngVErrMemory(ctxt);
        return (-1);
    }
    memset(list, 0, nbgroups * sizeof(xmlNodePtr));
    lasts = (xmlNodePtr *) xmlMalloc(nbgroups * sizeof(xmlNodePtr));
    if (lasts == NULL) {
        xmlRngVErrMemory(ctxt);
        return (-1);
    }
    memset(lasts, 0, nbgroups * sizeof(xmlNodePtr));

    /*
     * Walk the sequence of children finding the right group and
     * sorting them in sequences.
     */
    cur = ctxt->state->seq;
    cur = xmlRelaxNGSkipIgnored(ctxt, cur);
    start = cur;
    while (cur != NULL) {
        ctxt->state->seq = cur;
        if ((partitions->triage != NULL) &&
            (partitions->flags & IS_DETERMINIST)) {
            void *tmp = NULL;

            if ((cur->type == XML_TEXT_NODE) ||
                (cur->type == XML_CDATA_SECTION_NODE)) {
                tmp = xmlHashLookup2(partitions->triage, BAD_CAST "#text",
                                     NULL);
            } else if (cur->type == XML_ELEMENT_NODE) {
                if (cur->ns != NULL) {
                    tmp = xmlHashLookup2(partitions->triage, cur->name,
                                         cur->ns->href);
                    if (tmp == NULL)
                        tmp = xmlHashLookup2(partitions->triage,
                                             BAD_CAST "#any",
                                             cur->ns->href);
                } else
                    tmp =
                        xmlHashLookup2(partitions->triage, cur->name,
                                       NULL);
                if (tmp == NULL)
                    tmp =
                        xmlHashLookup2(partitions->triage, BAD_CAST "#any",
                                       NULL);
            }

            if (tmp == NULL) {
                i = nbgroups;
            } else {
                i = XML_PTR_TO_INT(tmp) - 1;
                if (partitions->flags & IS_NEEDCHECK) {
                    group = partitions->groups[i];
                    if (!xmlRelaxNGNodeMatchesList(cur, group->defs))
                        i = nbgroups;
                }
            }
        } else {
            for (i = 0; i < nbgroups; i++) {
                group = partitions->groups[i];
                if (group == NULL)
                    continue;
                if (xmlRelaxNGNodeMatchesList(cur, group->defs))
                    break;
            }
        }
        /*
         * We break as soon as an element not matched is found
         */
        if (i >= nbgroups) {
            break;
        }
        if (lasts[i] != NULL) {
            lasts[i]->next = cur;
            lasts[i] = cur;
        } else {
            list[i] = cur;
            lasts[i] = cur;
        }
        if (cur->next != NULL)
            lastchg = cur->next;
        else
            lastchg = cur;
        cur = xmlRelaxNGSkipIgnored(ctxt, cur->next);
    }
    if (ret != 0) {
        VALID_ERR(XML_RELAXNG_ERR_INTERSEQ);
        ret = -1;
        goto done;
    }
    lastelem = cur;
    oldstate = ctxt->state;
    for (i = 0; i < nbgroups; i++) {
        ctxt->state = xmlRelaxNGCopyValidState(ctxt, oldstate);
	if (ctxt->state == NULL) {
	    ret = -1;
	    break;
	}
        group = partitions->groups[i];
        if (lasts[i] != NULL) {
            last = lasts[i]->next;
            lasts[i]->next = NULL;
        }
        ctxt->state->seq = list[i];
        ret = xmlRelaxNGValidateDefinition(ctxt, group->rule);
        if (ret != 0)
            break;
        if (ctxt->state != NULL) {
            cur = ctxt->state->seq;
            cur = xmlRelaxNGSkipIgnored(ctxt, cur);
            xmlRelaxNGFreeValidState(ctxt, oldstate);
            oldstate = ctxt->state;
            ctxt->state = NULL;
            if (cur != NULL
                    /* there's a nasty violation of context-free unambiguities,
                       since in open-name-class context, interleave in the
                       production shall finish without caring about anything
                       else that is OK to follow in that case -- it would
                       otherwise get marked as "extra content" and would
                       hence fail the validation, hence this perhaps
                       dirty attempt to rectify such a situation */
                    && (define->parent->type != XML_RELAXNG_DEF
                        || !xmlStrEqual(define->parent->name,
                                        (const xmlChar *) "open-name-class"))) {
                VALID_ERR2(XML_RELAXNG_ERR_INTEREXTRA, cur->name);
                ret = -1;
                ctxt->state = oldstate;
                goto done;
            }
        } else if (ctxt->states != NULL) {
            int j;
            int found = 0;
	    int best = -1;
	    int lowattr = -1;

	    /*
	     * PBM: what happen if there is attributes checks in the interleaves
	     */

            for (j = 0; j < ctxt->states->nbState; j++) {
                cur = ctxt->states->tabState[j]->seq;
                cur = xmlRelaxNGSkipIgnored(ctxt, cur);
                if (cur == NULL) {
		    if (found == 0) {
		        lowattr = ctxt->states->tabState[j]->nbAttrLeft;
			best = j;
		    }
                    found = 1;
		    if (ctxt->states->tabState[j]->nbAttrLeft <= lowattr) {
		        /* try  to keep the latest one to mach old heuristic */
		        lowattr = ctxt->states->tabState[j]->nbAttrLeft;
			best = j;
		    }
                    if (lowattr == 0)
		        break;
                } else if (found == 0) {
                    if (lowattr == -1) {
		        lowattr = ctxt->states->tabState[j]->nbAttrLeft;
			best = j;
		    } else
		    if (ctxt->states->tabState[j]->nbAttrLeft <= lowattr)  {
		        /* try  to keep the latest one to mach old heuristic */
		        lowattr = ctxt->states->tabState[j]->nbAttrLeft;
			best = j;
		    }
		}
            }
	    /*
	     * BIG PBM: here we pick only one restarting point :-(
	     */
            if (ctxt->states->nbState > 0) {
                xmlRelaxNGFreeValidState(ctxt, oldstate);
		if (best != -1) {
		    oldstate = ctxt->states->tabState[best];
		    ctxt->states->tabState[best] = NULL;
		} else {
		    oldstate =
			ctxt->states->tabState[ctxt->states->nbState - 1];
                    ctxt->states->tabState[ctxt->states->nbState - 1] = NULL;
                    ctxt->states->nbState--;
		}
            }
            for (j = 0; j < ctxt->states->nbState ; j++) {
                xmlRelaxNGFreeValidState(ctxt, ctxt->states->tabState[j]);
            }
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
            if (found == 0) {
                if (cur == NULL) {
		    VALID_ERR2(XML_RELAXNG_ERR_INTEREXTRA,
			       (const xmlChar *) "noname");
                } else {
                    VALID_ERR2(XML_RELAXNG_ERR_INTEREXTRA, cur->name);
                }
                ret = -1;
                ctxt->state = oldstate;
                goto done;
            }
        } else {
            ret = -1;
            break;
        }
        if (lasts[i] != NULL) {
            lasts[i]->next = last;
        }
    }
    if (ctxt->state != NULL)
        xmlRelaxNGFreeValidState(ctxt, ctxt->state);
    ctxt->state = oldstate;
    ctxt->state->seq = lastelem;
    if (ret != 0) {
        VALID_ERR(XML_RELAXNG_ERR_INTERSEQ);
        ret = -1;
        goto done;
    }

  done:
    ctxt->flags = oldflags;
    /*
     * builds the next links chain from the prev one
     */
    cur = lastchg;
    while (cur != NULL) {
        if ((cur == start) || (cur->prev == NULL))
            break;
        cur->prev->next = cur;
        cur = cur->prev;
    }
    if (ret == 0) {
        if (ctxt->errNr > errNr)
            xmlRelaxNGPopErrors(ctxt, errNr);
    }

    xmlFree(list);
    xmlFree(lasts);
    return (ret);
}